

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScene::mouseReleaseEvent(QGraphicsScene *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  QGraphicsScenePrivate *this_00;
  long lVar1;
  QGraphicsItem **ppQVar2;
  QFlagsStorage<Qt::MouseButton> QVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsScenePrivate **)(this + 8);
  if ((this_00->mouseGrabberItems).d.size == 0) {
    (mouseEvent->super_QGraphicsSceneEvent).field_0xc = 0;
  }
  else {
    QGraphicsScenePrivate::sendMouseEvent(this_00,mouseEvent);
    (mouseEvent->super_QGraphicsSceneEvent).field_0xc = 1;
    QVar3.i = (Int)QGraphicsSceneMouseEvent::buttons(mouseEvent);
    if ((QFlagsStorage<Qt::MouseButton>)QVar3.i == (QFlagsStorage<Qt::MouseButton>)0x0) {
      lVar1 = (this_00->mouseGrabberItems).d.size;
      if (lVar1 == 0) {
        this_00->lastMouseGrabberItem = (QGraphicsItem *)0x0;
      }
      else {
        ppQVar2 = (this_00->mouseGrabberItems).d.ptr;
        this_00->lastMouseGrabberItem = ppQVar2[lVar1 + -1];
        if ((this_00->field_0xb9 & 8) != 0) {
          QGraphicsItem::ungrabMouse(ppQVar2[lVar1 + -1]);
        }
      }
      local_28.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)&local_38,None)
      ;
      _q_hoverFromMouseEvent((QGraphicsSceneHoverEvent *)&local_38,mouseEvent);
      QGraphicsScenePrivate::dispatchHoverEvent(this_00,(QGraphicsSceneHoverEvent *)&local_38);
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::mouseReleaseEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_D(QGraphicsScene);
    if (d->mouseGrabberItems.isEmpty()) {
        mouseEvent->ignore();
        return;
    }

    // Forward the event to the mouse grabber
    d->sendMouseEvent(mouseEvent);
    mouseEvent->accept();

    // Reset the mouse grabber when the last mouse button has been released.
    if (!mouseEvent->buttons()) {
        if (!d->mouseGrabberItems.isEmpty()) {
            d->lastMouseGrabberItem = d->mouseGrabberItems.constLast();
            if (d->lastMouseGrabberItemHasImplicitMouseGrab)
                d->mouseGrabberItems.constLast()->ungrabMouse();
        } else {
            d->lastMouseGrabberItem = nullptr;
        }

        // Generate a hoverevent
        QGraphicsSceneHoverEvent hoverEvent;
        _q_hoverFromMouseEvent(&hoverEvent, mouseEvent);
        d->dispatchHoverEvent(&hoverEvent);
    }
}